

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O2

adios2_error adios2_engine_get_type(char *type,size_t *size,adios2_engine *engine)

{
  allocator local_80 [32];
  string local_60;
  string local_40;
  
  std::__cxx11::string::string
            ((string *)&local_40,"for const adios2_engine, in call to adios2_engine_get_type",
             local_80);
  adios2::helper::CheckForNullptr<adios2_engine_const>(engine,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string
            ((string *)&local_60,"for size_t* size, in call to adios2_engine_get_type",local_80);
  adios2::helper::CheckForNullptr<unsigned_long>(size,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  anon_unknown.dwarf_24013::String2CAPI((string *)(engine + 8),type,size);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_engine_get_type(char *type, size_t *size, const adios2_engine *engine)
{
    try
    {
        adios2::helper::CheckForNullptr(
            engine, "for const adios2_engine, in call to adios2_engine_get_type");

        const adios2::core::Engine *engineCpp =
            reinterpret_cast<const adios2::core::Engine *>(engine);

        adios2::helper::CheckForNullptr(size,
                                        "for size_t* size, in call to adios2_engine_get_type");

        return String2CAPI(engineCpp->m_EngineType, type, size);
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_engine_get_type"));
    }
}